

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaCheckCOSDerivedOK
              (xmlSchemaAbstractCtxtPtr actxt,xmlSchemaTypePtr type,xmlSchemaTypePtr baseType,
              int set)

{
  xmlSchemaTypePtr pxVar1;
  int iVar2;
  xmlSchemaTypeLinkPtr pxVar3;
  
  if (type->type != XML_SCHEMA_TYPE_SIMPLE) {
    if ((type->type == XML_SCHEMA_TYPE_BASIC) && (type->builtInType != 0x2d)) {
      iVar2 = xmlSchemaCheckCOSSTDerivedOK(actxt,type,baseType,set);
      return iVar2;
    }
    while( true ) {
      if (((type != (xmlSchemaTypePtr)0x0) && (baseType != (xmlSchemaTypePtr)0x0)) &&
         (type == baseType)) {
        return 0;
      }
      if ((((set & 2U) != 0) && ((type->flags & 2) != 0)) ||
         (((set & 1U) != 0 && ((type->flags & 4) != 0)))) break;
      type = type->baseType;
      if (type == baseType) {
        return 0;
      }
      if (type->type != XML_SCHEMA_TYPE_COMPLEX) {
        if ((type->type == XML_SCHEMA_TYPE_BASIC) && (type->builtInType == 0x2d)) {
          return 1;
        }
        if (type->builtInType != 0x2d) {
          iVar2 = xmlSchemaCheckCOSSTDerivedOK(actxt,type,baseType,set);
          return iVar2;
        }
      }
    }
    return 1;
  }
  if (type == baseType) {
    return 0;
  }
  if ((((type->type == XML_SCHEMA_TYPE_BASIC) || ((type->flags & 0x400000) != 0)) ||
      (iVar2 = xmlSchemaTypeFixup(type,actxt), iVar2 != -1)) &&
     (((baseType->type == XML_SCHEMA_TYPE_BASIC || ((baseType->flags & 0x400000) != 0)) ||
      (iVar2 = xmlSchemaTypeFixup(baseType,actxt), iVar2 != -1)))) {
    iVar2 = 0xbd7;
    if (((set & 1U) == 0) &&
       ((pxVar1 = type->baseType, pxVar1 == (xmlSchemaTypePtr)0x0 || ((pxVar1->flags & 0x400) == 0))
       )) {
      if ((pxVar1 == baseType) ||
         (((pxVar1->type != XML_SCHEMA_TYPE_BASIC || (pxVar1->builtInType != 0x2d)) &&
          (iVar2 = xmlSchemaCheckCOSSTDerivedOK(actxt,pxVar1,baseType,set), iVar2 == 0)))) {
        iVar2 = 0;
      }
      else if (((baseType->type != XML_SCHEMA_TYPE_BASIC) || (baseType->builtInType != 0x2e)) ||
              (iVar2 = 0, (type->flags & 0xc0) == 0)) {
        if ((baseType->flags & 0x80) != 0) {
          pxVar3 = (xmlSchemaTypeLinkPtr)&baseType->memberTypes;
          do {
            pxVar3 = pxVar3->next;
            if (pxVar3 == (xmlSchemaTypeLinkPtr)0x0) goto LAB_001a4ed1;
            pxVar1 = pxVar3->type;
            if (((pxVar1->type != XML_SCHEMA_TYPE_BASIC) && ((pxVar1->flags & 0x400000) == 0)) &&
               (iVar2 = xmlSchemaTypeFixup(pxVar1,actxt), iVar2 == -1)) {
              iVar2 = -1;
              goto LAB_001a4ed1;
            }
            iVar2 = xmlSchemaCheckCOSSTDerivedOK(actxt,type,pxVar3->type,set);
          } while (iVar2 != 0);
          iVar2 = 0;
LAB_001a4ed1:
          if (pxVar3 != (xmlSchemaTypeLinkPtr)0x0) {
            return iVar2;
          }
        }
        iVar2 = 0xbd8;
      }
    }
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int
xmlSchemaCheckCOSDerivedOK(xmlSchemaAbstractCtxtPtr actxt,
			   xmlSchemaTypePtr type,
			   xmlSchemaTypePtr baseType,
			   int set)
{
    if (WXS_IS_SIMPLE(type))
	return (xmlSchemaCheckCOSSTDerivedOK(actxt, type, baseType, set));
    else
	return (xmlSchemaCheckCOSCTDerivedOK(actxt, type, baseType, set));
}